

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O2

bool __thiscall zmq::ctx_t::start(ctx_t *this)

{
  vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *this_00;
  int iVar1;
  int iVar2;
  pointer ppiVar3;
  value_type piVar4;
  empty_slots_t *this_01;
  bool bVar5;
  reaper_t *prVar6;
  mailbox_t *pmVar7;
  io_thread_t *this_02;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  size_type __n;
  value_type local_40;
  empty_slots_t *local_38;
  
  mutex_t::lock((mutex_t *)this);
  iVar1 = this->_max_sockets;
  iVar2 = this->_io_thread_count;
  mutex_t::unlock((mutex_t *)this);
  __n = (long)iVar2 + (long)iVar1 + 2;
  this_00 = &this->_slots;
  std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::reserve(this_00,__n);
  local_38 = &this->_empty_slots;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(local_38,(long)(iVar1 + iVar2));
  uVar10 = 2;
  std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::resize(this_00,2);
  *(this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>._M_impl.
   super__Vector_impl_data._M_start = &(this->_term_mailbox).super_i_mailbox;
  prVar6 = (reaper_t *)operator_new(0xf0,(nothrow_t *)&std::nothrow);
  if (prVar6 == (reaper_t *)0x0) {
    this->_reaper = (reaper_t *)0x0;
    piVar8 = __errno_location();
    *piVar8 = 0xc;
  }
  else {
    reaper_t::reaper_t(prVar6,this,1);
    this->_reaper = prVar6;
    pmVar7 = reaper_t::get_mailbox(prVar6);
    bVar5 = mailbox_t::valid(pmVar7);
    if (bVar5) {
      pmVar7 = reaper_t::get_mailbox(this->_reaper);
      (this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>._M_impl
      .super__Vector_impl_data._M_start[1] = &pmVar7->super_i_mailbox;
      reaper_t::start(this->_reaper);
      local_40 = (io_thread_t *)0x0;
      std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::resize
                (this_00,__n,(value_type *)&local_40);
      while( true ) {
        this_01 = local_38;
        if (iVar2 + 2U == uVar10) {
          uVar10 = (ulong)((long)(this->_slots).
                                 super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_slots).
                                super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3;
          while ((int)(iVar2 + 2U) < (int)uVar10) {
            uVar9 = (int)uVar10 - 1;
            local_40 = (value_type)CONCAT44(local_40._4_4_,uVar9);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (this_01,(uint *)&local_40);
            uVar10 = (ulong)uVar9;
          }
          this->_starting = false;
          return true;
        }
        this_02 = (io_thread_t *)operator_new(0xe0,(nothrow_t *)&std::nothrow);
        if (this_02 == (io_thread_t *)0x0) {
          piVar8 = __errno_location();
          *piVar8 = 0xc;
          goto LAB_001540e6;
        }
        io_thread_t::io_thread_t(this_02,this,(uint32_t)uVar10);
        local_40 = this_02;
        pmVar7 = io_thread_t::get_mailbox(this_02);
        bVar5 = mailbox_t::valid(pmVar7);
        piVar4 = local_40;
        if (!bVar5) break;
        std::vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>::push_back
                  (&this->_io_threads,&local_40);
        pmVar7 = io_thread_t::get_mailbox(local_40);
        (this_00->super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar10] = &pmVar7->super_i_mailbox;
        io_thread_t::start(local_40);
        uVar10 = uVar10 + 1;
      }
      if (local_40 != (io_thread_t *)0x0) {
        io_thread_t::~io_thread_t(local_40);
      }
      operator_delete(piVar4,0xe0);
    }
LAB_001540e6:
    reaper_t::stop(this->_reaper);
    prVar6 = this->_reaper;
    if (prVar6 != (reaper_t *)0x0) {
      reaper_t::~reaper_t(prVar6);
    }
    operator_delete(prVar6,0xf0);
    this->_reaper = (reaper_t *)0x0;
  }
  ppiVar3 = (this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppiVar3) {
    (this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppiVar3;
  }
  return false;
}

Assistant:

bool zmq::ctx_t::start ()
{
    //  Initialise the array of mailboxes. Additional two slots are for
    //  zmq_ctx_term thread and reaper thread.
    _opt_sync.lock ();
    const int term_and_reaper_threads_count = 2;
    const int mazmq = _max_sockets;
    const int ios = _io_thread_count;
    _opt_sync.unlock ();
    const int slot_count = mazmq + ios + term_and_reaper_threads_count;
    try {
        _slots.reserve (slot_count);
        _empty_slots.reserve (slot_count - term_and_reaper_threads_count);
    }
    catch (const std::bad_alloc &) {
        errno = ENOMEM;
        return false;
    }
    _slots.resize (term_and_reaper_threads_count);

    //  Initialise the infrastructure for zmq_ctx_term thread.
    _slots[term_tid] = &_term_mailbox;

    //  Create the reaper thread.
    _reaper = new (std::nothrow) reaper_t (this, reaper_tid);
    if (!_reaper) {
        errno = ENOMEM;
        goto fail_cleanup_slots;
    }
    if (!_reaper->get_mailbox ()->valid ())
        goto fail_cleanup_reaper;
    _slots[reaper_tid] = _reaper->get_mailbox ();
    _reaper->start ();

    //  Create I/O thread objects and launch them.
    _slots.resize (slot_count, NULL);

    for (int i = term_and_reaper_threads_count;
         i != ios + term_and_reaper_threads_count; i++) {
        io_thread_t *io_thread = new (std::nothrow) io_thread_t (this, i);
        if (!io_thread) {
            errno = ENOMEM;
            goto fail_cleanup_reaper;
        }
        if (!io_thread->get_mailbox ()->valid ()) {
            delete io_thread;
            goto fail_cleanup_reaper;
        }
        _io_threads.push_back (io_thread);
        _slots[i] = io_thread->get_mailbox ();
        io_thread->start ();
    }

    //  In the unused part of the slot array, create a list of empty slots.
    for (int32_t i = static_cast<int32_t> (_slots.size ()) - 1;
         i >= static_cast<int32_t> (ios) + term_and_reaper_threads_count; i--) {
        _empty_slots.push_back (i);
    }

    _starting = false;
    return true;

fail_cleanup_reaper:
    _reaper->stop ();
    delete _reaper;
    _reaper = NULL;

fail_cleanup_slots:
    _slots.clear ();
    return false;
}